

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateTailCallTable
          (ParseFunctionGenerator *this,Printer *p)

{
  cpp *this_00;
  TailCallTableInfo *pTVar1;
  pointer puVar2;
  pointer puVar3;
  long *plVar4;
  bool bVar5;
  size_type in_RCX;
  SkipEntryBlock *block;
  long lVar6;
  Span<const_google::protobuf::FieldDescriptor_*const> field_descriptors;
  anon_class_16_2_fd512ddd_for_cb_conflict2 GenerateAuxEntries;
  NumToEntryTable field_num_to_entry_table;
  anon_class_1_0_00000001 local_9e1;
  Printer *local_9e0;
  undefined1 *local_9d8;
  undefined8 local_9d0;
  undefined1 local_9c8;
  undefined7 uStack_9c7;
  undefined8 uStack_9c0;
  undefined1 *local_9b8;
  undefined8 local_9b0;
  undefined1 local_9a8;
  undefined7 uStack_9a7;
  undefined8 uStack_9a0;
  undefined1 *local_998;
  undefined8 local_990;
  undefined1 local_988;
  undefined7 uStack_987;
  undefined8 uStack_980;
  undefined1 *local_978;
  undefined8 local_970;
  undefined1 local_968;
  undefined7 uStack_967;
  undefined8 uStack_960;
  undefined1 *local_958;
  undefined8 local_950;
  undefined1 local_948;
  undefined7 uStack_947;
  undefined8 uStack_940;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  local_938;
  string local_928;
  string local_908;
  string local_8e8;
  undefined1 local_8c8 [32];
  string local_8a8;
  string local_888;
  int local_868;
  int local_864;
  undefined1 local_860 [16];
  NumToEntryTable local_850;
  unsigned_long local_830;
  unsigned_long local_828;
  char *local_820;
  Sub local_818;
  Sub local_760;
  Sub local_6a8;
  Sub local_5f0;
  Sub local_538;
  Sub local_480;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  long *local_3a8;
  undefined8 local_3a0;
  code *local_398;
  code *local_390;
  undefined1 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  long *local_2f0;
  undefined8 local_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  undefined8 *local_180;
  undefined8 local_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 local_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  local_9e0 = p;
  io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&,void,void>
            (&local_938,p,&this->variables_);
  this_00 = (cpp *)(this->ordered_fields_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  field_descriptors.ptr_ =
       (pointer)((long)(this->ordered_fields_).
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 3);
  field_descriptors.len_ = in_RCX;
  MakeNumToEntryTable(&local_850,this_00,field_descriptors);
  local_860._8_8_ = &local_9e0;
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  local_860._0_8_ = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"const","");
  bVar5 = IsFileDescriptorProto(this->descriptor_->file_,this->options_);
  local_820 = "PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\nconst";
  if (bVar5) {
    local_820 = "constexpr";
  }
  io::Printer::Sub::Sub<char_const*>(&local_818,&local_888,&local_820);
  local_8a8._M_dataplus._M_p = (pointer)&local_8a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a8,"table_size_log2","");
  io::Printer::Sub::Sub<int&>
            (&local_760,&local_8a8,
             &((this->tc_table_info_)._M_t.
               super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
               .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
              _M_head_impl)->table_size_log2);
  local_8c8._0_8_ = local_8c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8c8,"ordered_size","");
  local_828 = (long)(this->ordered_fields_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->ordered_fields_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  io::Printer::Sub::Sub<unsigned_long>(&local_6a8,(string *)local_8c8,&local_828);
  local_8e8._M_dataplus._M_p = (pointer)&local_8e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e8,"aux_size","");
  pTVar1 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
           _M_head_impl;
  local_830 = (long)(pTVar1->aux_entries).
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              *(long *)&(pTVar1->aux_entries).
                        super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                        ._M_impl >> 4;
  io::Printer::Sub::Sub<unsigned_long>(&local_5f0,&local_8e8,&local_830);
  local_908._M_dataplus._M_p = (pointer)&local_908.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_908,"data_size","");
  pTVar1 = (this->tc_table_info_)._M_t.
           super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
           .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>.
           _M_head_impl;
  puVar2 = *(pointer *)
            &(pTVar1->field_name_data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
  puVar3 = (pTVar1->field_name_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_864 = 0;
  if (puVar3 != puVar2) {
    local_864 = ((int)puVar3 - (int)puVar2) + 1;
  }
  io::Printer::Sub::Sub<int>(&local_538,&local_908,&local_864);
  local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_928,"field_num_to_entry_table_size","");
  local_868 = 2;
  for (; local_850.blocks.
         super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_850.blocks.
         super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_finish;
      local_850.blocks.
      super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_850.blocks.
           super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) {
    local_868 = local_868 +
                ((uint)((ulong)((long)((local_850.blocks.
                                        super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->entries).
                                      super__Vector_base<google::protobuf::compiler::cpp::SkipEntry16,_std::allocator<google::protobuf::compiler::cpp::SkipEntry16>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)((local_850.blocks.
                                       super__Vector_base<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->entries).
                                     super__Vector_base<google::protobuf::compiler::cpp::SkipEntry16,_std::allocator<google::protobuf::compiler::cpp::SkipEntry16>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 1) & 0xfffffffe)
                + 3;
  }
  io::Printer::Sub::Sub<int>(&local_480,&local_928,&local_868);
  local_998 = &local_988;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_998,"table_base","");
  local_3c8 = local_3b8;
  if (local_998 == &local_988) {
    uStack_3b0 = uStack_980;
  }
  else {
    local_3c8 = local_998;
  }
  local_3c0 = local_990;
  local_990 = 0;
  local_988 = 0;
  local_998 = &local_988;
  local_3a8 = (long *)operator_new(0x20);
  *local_3a8 = (long)&local_9e0;
  local_3a8[1] = (long)this;
  local_3a8[2] = (long)&local_850;
  *(undefined1 *)(local_3a8 + 3) = 0;
  local_390 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_3a0 = 0;
  local_398 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_388 = 1;
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x522f0c);
  local_318 = 0;
  local_9b8 = &local_9a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b8,"fast_entries","");
  local_310 = local_300;
  if (local_9b8 == &local_9a8) {
    uStack_2f8 = uStack_9a0;
  }
  else {
    local_310 = local_9b8;
  }
  local_308 = local_9b0;
  local_9b0 = 0;
  local_9a8 = 0;
  local_9b8 = &local_9a8;
  local_2f0 = (long *)operator_new(0x18);
  *local_2f0 = (long)&local_9e0;
  local_2f0[1] = (long)this;
  *(undefined1 *)(local_2f0 + 2) = 0;
  local_2d8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_2e8 = 0;
  local_2e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2d0 = 1;
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x522f0c);
  local_260 = 0;
  local_9d8 = &local_9c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"field_lookup_table","");
  local_258 = local_248;
  if (local_9d8 == &local_9c8) {
    uStack_240 = uStack_9c0;
  }
  else {
    local_258 = local_9d8;
  }
  local_250 = local_9d0;
  local_9d0 = 0;
  local_9c8 = 0;
  local_9d8 = &local_9c8;
  local_238 = (undefined8 *)operator_new(0x18);
  *local_238 = &local_850;
  local_238[1] = &local_9e0;
  *(undefined1 *)(local_238 + 2) = 0;
  local_220 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_230 = 0;
  local_228 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_218 = 1;
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x522f0c);
  local_1a8 = 0;
  local_958 = &local_948;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_958,"field_and_aux_entries","");
  local_1a0 = local_190;
  if (local_958 == &local_948) {
    uStack_188 = uStack_940;
  }
  else {
    local_1a0 = local_958;
  }
  local_198 = local_950;
  local_950 = 0;
  local_948 = 0;
  local_958 = &local_948;
  local_180 = (undefined8 *)operator_new(0x20);
  *local_180 = this;
  local_180[1] = &local_9e0;
  local_180[2] = local_860;
  *(undefined1 *)(local_180 + 3) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  local_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x522f0c);
  local_f0 = 0;
  local_978 = &local_968;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_978,"field_names","");
  local_e8 = local_d8;
  if (local_978 == &local_968) {
    uStack_d0 = uStack_960;
  }
  else {
    local_e8 = local_978;
  }
  local_e0 = local_970;
  local_970 = 0;
  local_968 = 0;
  local_978 = &local_968;
  local_c8 = (long *)operator_new(0x18);
  *local_c8 = (long)&local_9e0;
  local_c8[1] = (long)this;
  *(undefined1 *)(local_c8 + 2) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x522f0c);
  local_38 = 0;
  io::Printer::Emit(p,&local_818,0xb,0x126,
                    "\n$const$ ::_pbi::TcParseTable<$table_size_log2$, $ordered_size$, $aux_size$, $data_size$, $field_num_to_entry_table_size$>\n$classname$::_table_ = {\n  {\n    $table_base$\n  }, {{\n    $fast_entries$\n  }}, {{\n    $field_lookup_table$\n  }}, $field_and_aux_entries$,\n  {{\n    $field_names$,\n  }},\n};\n"
                   );
  lVar6 = 0x7e8;
  do {
    if (*(char *)((long)&local_820 + lVar6) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_860 + lVar6));
    }
    plVar4 = *(long **)((long)&local_888._M_dataplus._M_p + lVar6);
    if ((long *)(local_888.field_2._M_local_buf + lVar6) != plVar4) {
      operator_delete(plVar4,*(long *)(local_888.field_2._M_local_buf + lVar6) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_8a8.field_2._M_local_buf[lVar6 + 8]]._M_data)
              (&local_9e1,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_8c8 + lVar6 + 0x18));
    local_8a8.field_2._M_local_buf[lVar6 + 8] = -1;
    if ((long *)(local_8c8 + lVar6 + 8) != *(long **)(local_8c8 + lVar6 + -8)) {
      operator_delete(*(long **)(local_8c8 + lVar6 + -8),*(long *)(local_8c8 + lVar6 + 8) + 1);
    }
    lVar6 = lVar6 + -0xb8;
  } while (lVar6 != 0);
  if (local_978 != &local_968) {
    operator_delete(local_978,CONCAT71(uStack_967,local_968) + 1);
  }
  if (local_958 != &local_948) {
    operator_delete(local_958,CONCAT71(uStack_947,local_948) + 1);
  }
  if (local_9d8 != &local_9c8) {
    operator_delete(local_9d8,CONCAT71(uStack_9c7,local_9c8) + 1);
  }
  if (local_9b8 != &local_9a8) {
    operator_delete(local_9b8,CONCAT71(uStack_9a7,local_9a8) + 1);
  }
  if (local_998 != &local_988) {
    operator_delete(local_998,CONCAT71(uStack_987,local_988) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908._M_dataplus._M_p != &local_908.field_2) {
    operator_delete(local_908._M_dataplus._M_p,local_908.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8._M_dataplus._M_p != &local_8e8.field_2) {
    operator_delete(local_8e8._M_dataplus._M_p,local_8e8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_8c8._0_8_ != local_8c8 + 0x10) {
    operator_delete((void *)local_8c8._0_8_,local_8c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
    operator_delete(local_8a8._M_dataplus._M_p,local_8a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<google::protobuf::compiler::cpp::SkipEntryBlock,_std::allocator<google::protobuf::compiler::cpp::SkipEntryBlock>_>
  ::~vector(&local_850.blocks);
  if (local_938.storage_.is_callback_engaged_ == true) {
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::pop_back((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                *)((long)local_938.storage_.callback_buffer_ + 0x98));
  }
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateTailCallTable(io::Printer* p) {
  auto v = p->WithVars(variables_);
  // For simplicity and speed, the table is not covering all proto
  // configurations. This model uses a fallback to cover all situations that
  // the table can't accommodate, together with unknown fields or extensions.
  // These are number of fields over 32, fields with 3 or more tag bytes,
  // maps, weak fields, lazy, more than 1 extension range. In the cases
  // the table is sufficient we can use a generic routine, that just handles
  // unknown fields and potentially an extension range.
  NumToEntryTable field_num_to_entry_table =
      MakeNumToEntryTable(ordered_fields_);

  auto GenerateTableBase = [&] {
    p->Emit(
        {{"has_bits_offset",
          [&] {
            if (num_hasbits_ > 0 || IsMapEntryMessage(descriptor_)) {
              p->Emit(
                  "PROTOBUF_FIELD_OFFSET($classname$, _impl_._has_bits_),\n");
            } else {
              p->Emit("0,  // no _has_bits_\n");
            }
          }},
         {"extension_offset",
          [&] {
            if (descriptor_->extension_range_count() != 0) {
              p->Emit("PROTOBUF_FIELD_OFFSET($classname$, $extensions$),\n");
            } else {
              p->Emit("0, // no _extensions_\n");
            }
          }},
         {"max_field_number",
          ordered_fields_.empty() ? 0 : ordered_fields_.back()->number()},
         {"fast_idx_mask", (((1 << tc_table_info_->table_size_log2) - 1) << 3)},
         {"skipmap32", field_num_to_entry_table.skipmap32},
         {"field_entries_offset",
          [&] {
            if (ordered_fields_.empty()) {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_names),  // no field_entries
              )cc");
            } else {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_entries),
              )cc");
            }
          }},
         {"num_field_entries", ordered_fields_.size()},
         {"num_aux_entries", tc_table_info_->aux_entries.size()},
         {"aux_offset",
          [&] {
            if (tc_table_info_->aux_entries.empty()) {
              p->Emit(R"cc(
                offsetof(decltype(_table_), field_names),  // no aux_entries
              )cc");
            } else {
              p->Emit(R"cc(
                offsetof(decltype(_table_), aux_entries),
              )cc");
            }
          }},
         {"class_data", [&] { p->Emit("$classname$_class_data_.base(),\n"); }},
         {"post_loop_handler",
          [&] {
            if (NeedsPostLoopHandler(descriptor_, options_)) {
              p->Emit("&$classname$::PostLoopHandler,\n");
            } else {
              p->Emit("nullptr,  // post_loop_handler\n");
            }
          }},
         {"fallback", TcParseFunctionName(tc_table_info_->fallback_function)},
         {"to_prefetch",
          [&] {
            std::vector<const FieldDescriptor*> subtable_fields;
            for (const auto& aux : tc_table_info_->aux_entries) {
              if (aux.type == internal::TailCallTableInfo::kSubTable) {
                subtable_fields.push_back(aux.field);
              }
            }
            const auto* hottest = FindHottestField(subtable_fields, options_);
            p->Emit(
                {{"hot_type", QualifiedClassName(hottest == nullptr
                                                     ? descriptor_
                                                     : hottest->message_type(),
                                                 options_)}},
                R"cc(
#ifdef PROTOBUF_PREFETCH_PARSE_TABLE
                  ::_pbi::TcParser::GetTable<$hot_type$>(),  // to_prefetch
#endif  // PROTOBUF_PREFETCH_PARSE_TABLE)cc");
          }}},
        // clang-format off
        R"cc(
        $has_bits_offset$,
        $extension_offset$,
        $max_field_number$, $fast_idx_mask$,  // max_field_number, fast_idx_mask
        offsetof(decltype(_table_), field_lookup_table),
        $skipmap32$,  // skipmap
        $field_entries_offset$,
        $num_field_entries$,  // num_field_entries
        $num_aux_entries$,  // num_aux_entries
        $aux_offset$,
        $class_data$,
        $post_loop_handler$,
        $fallback$,  // fallback
        $to_prefetch$)cc"
        // clang-format on
    );
  };

  auto GenerateAuxEntries = [&] {
    for (const auto& aux_entry : tc_table_info_->aux_entries) {
      switch (aux_entry.type) {
        case TailCallTableInfo::kNothing:
          p->Emit("{},\n");
          break;
        case TailCallTableInfo::kInlinedStringDonatedOffset:
          p->Emit(
              "{_fl::Offset{offsetof($classname$, "
              "_impl_._inlined_string_donated_)}},\n");
          break;
        case TailCallTableInfo::kSplitOffset:
          p->Emit("{_fl::Offset{offsetof($classname$, _impl_._split_)}},\n");
          break;
        case TailCallTableInfo::kSplitSizeof:
          p->Emit("{_fl::Offset{sizeof($classname$::Impl_::Split)}},\n");
          break;
        case TailCallTableInfo::kSubMessage:
          p->Emit({{"name", QualifiedDefaultInstanceName(
                                aux_entry.field->message_type(), options_)}},
                  "{::_pbi::FieldAuxDefaultMessage{}, &$name$},\n");
          break;
        case TailCallTableInfo::kSubTable:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->message_type(),
                                               options_)}},
                  "{::_pbi::TcParser::GetTable<$name$>()},\n");
          break;
        case TailCallTableInfo::kSubMessageWeak:
          p->Emit({{"ptr", QualifiedDefaultInstancePtr(
                               aux_entry.field->message_type(), options_)}},
                  "{::_pbi::FieldAuxDefaultMessage{}, &$ptr$},\n");
          break;
        case TailCallTableInfo::kMessageVerifyFunc:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->message_type(),
                                               options_)}},
                  "{$name$::InternalVerify},\n");
          break;
        case TailCallTableInfo::kSelfVerifyFunc:
          if (ShouldVerify(descriptor_, options_, scc_analyzer_)) {
            p->Emit("{&InternalVerify},\n");
          } else {
            p->Emit("{},\n");
          }
          break;
        case TailCallTableInfo::kEnumRange:
          p->Emit(
              {
                  {"first", aux_entry.enum_range.first},
                  {"last", aux_entry.enum_range.last},
              },
              "{$first$, $last$},\n");
          break;
        case TailCallTableInfo::kEnumValidator:
          p->Emit({{"name", QualifiedClassName(aux_entry.field->enum_type(),
                                               options_)}},
                  "{::_pbi::FieldAuxEnumData{}, $name$_internal_data_},\n");
          break;
        case TailCallTableInfo::kNumericOffset:
          p->Emit(
              {
                  {"offset", aux_entry.offset},
              },
              "{_fl::Offset{$offset$}},\n");
          break;
        case TailCallTableInfo::kMapAuxInfo: {
          auto utf8_check = internal::cpp::GetUtf8CheckMode(
              aux_entry.field,
              GetOptimizeFor(aux_entry.field->file(), options_) ==
                  FileOptions::LITE_RUNTIME);
          auto* map_key = aux_entry.field->message_type()->map_key();
          auto* map_value = aux_entry.field->message_type()->map_value();
          const bool validated_enum =
              map_value->type() == FieldDescriptor::TYPE_ENUM &&
              !internal::cpp::HasPreservingUnknownEnumSemantics(map_value);
          p->Emit(
              {
                  {"strict", utf8_check == Utf8CheckMode::kStrict},
                  {"verify", utf8_check == Utf8CheckMode::kVerify},
                  {"validate", validated_enum},
                  {"key_wire", map_key->type()},
                  {"value_wire", map_value->type()},
                  {"is_lite",
                   !HasDescriptorMethods(aux_entry.field->file(), options_)},
              },
              R"cc(
                {::_pbi::TcParser::GetMapAuxInfo($strict$, $verify$, $validate$,
                                                 $key_wire$, $value_wire$,
                                                 $is_lite$)},
              )cc");
          break;
        }
      }
    }
  };

  p->Emit(
      {{"const",
        // FileDescriptorProto's table must be constant initialized. For MSVC
        // this means using `constexpr`. However, we can't use `constexpr`
        // for all tables because it breaks when crossing DLL boundaries.
        // FileDescriptorProto is safe from this.
        IsFileDescriptorProto(descriptor_->file(), options_)
            ? "constexpr"
            : "PROTOBUF_CONSTINIT PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\nconst"},
       {"table_size_log2", tc_table_info_->table_size_log2},
       {"ordered_size", ordered_fields_.size()},
       {"aux_size", tc_table_info_->aux_entries.size()},
       {"data_size", FieldNameDataSize(tc_table_info_->field_name_data)},
       {"field_num_to_entry_table_size", field_num_to_entry_table.size16()},
       {"table_base", GenerateTableBase},
       {"fast_entries",
        [&] {
          // TODO: refactor this to use Emit.
          Formatter format(p, variables_);
          GenerateFastFieldEntries(format);
        }},
       {"field_lookup_table",
        [&] {
          for (SkipEntryBlock& entry_block : field_num_to_entry_table.blocks) {
            p->Emit(
                {
                    {"lower", entry_block.first_fnum & 65535},
                    {"upper", entry_block.first_fnum / 65536},
                    {"size", entry_block.entries.size()},
                },
                "$lower$, $upper$, $size$,\n");

            for (SkipEntry16 se16 : entry_block.entries) {
              p->Emit({{"skipmap", se16.skipmap},
                       {"offset", se16.field_entry_offset}},
                      R"cc(
                        $skipmap$, $offset$,
                      )cc");
            }
          }

          // The last entry of the skipmap are all 1's.
          p->Emit("65535, 65535\n");
        }},
       {"field_and_aux_entries",
        [&] {
          if (ordered_fields_.empty() &&
              !descriptor_->options().message_set_wire_format()) {
            ABSL_DLOG_IF(FATAL, !tc_table_info_->aux_entries.empty())
                << "Invalid message: " << descriptor_->full_name() << " has "
                << tc_table_info_->aux_entries.size()
                << " auxiliary field entries, but no fields";
            p->Emit("// no field_entries, or aux_entries\n");
            return;
          }

          p->Emit(
              {
                  {"field_entries",
                   [&] {
                     // TODO: refactor this to use Emit.
                     Formatter format(p, variables_);
                     GenerateFieldEntries(format);
                   }},
                  {"aux_entries",
                   [&] {
                     if (tc_table_info_->aux_entries.empty()) {
                       p->Emit("// no aux_entries\n");
                     } else {
                       p->Emit(
                           {
                               {"aux_entries_list", GenerateAuxEntries},
                           },
                           // clang-format off
                              R"cc(
                                {{
                                    $aux_entries_list$
                                }},
                              )cc"
                           // clang-format on
                       );
                     }
                   }},
              },
              // clang-format off
                 R"cc(
                 {{
                   $field_entries$,
                 }},
                 $aux_entries$)cc"
              // clang-format on
          );
        }},
       {"field_names",
        [&] {
          Formatter format(p, variables_);
          GenerateFieldNames(format);
        }}},
      // Disable clang-format, as we want to generate a denser table
      // representation than what clang-format typically wants. clang would
      // insert a newline at every brace, whereas we prefer {{ ... }} here.
      // clang-format off
R"cc(
$const$ ::_pbi::TcParseTable<$table_size_log2$, $ordered_size$, $aux_size$, $data_size$, $field_num_to_entry_table_size$>
$classname$::_table_ = {
  {
    $table_base$
  }, {{
    $fast_entries$
  }}, {{
    $field_lookup_table$
  }}, $field_and_aux_entries$,
  {{
    $field_names$,
  }},
};
)cc"
      // clang-format on
  );
}